

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>::
insert<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,unsigned_long&>
          (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>
                 table,size_t pos,unsigned_long *params)

{
  uint uVar1;
  ulong uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  HashIndex<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Callbacks> *this_00
  ;
  HashBucket *pHVar7;
  uint uVar8;
  size_t sVar9;
  ulong *in_R9;
  HashBucket *pHVar10;
  Maybe<unsigned_long> MVar11;
  
  this_00 = (HashIndex<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
             *)table.ptr;
  if ((this_00->buckets).size_ * 2 < (this_00->erasedCount + pos) * 3 + 3) {
    HashIndex<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>::
    rehash(this_00,pos * 3 + 3);
  }
  uVar2 = *in_R9;
  if (uVar2 >> 0x20 == 0) {
    uVar5 = (uint)uVar2 * 0x8000 + ~(uint)uVar2;
    uVar5 = (uVar5 >> 0xc ^ uVar5) * 5;
    uVar5 = (uVar5 >> 4 ^ uVar5) * 0x809;
    uVar5 = uVar5 >> 0x10 ^ uVar5;
  }
  else {
    uVar6 = uVar2 * 0x40000 + ~uVar2;
    uVar6 = (uVar6 >> 0x1f ^ uVar6) * 0x15;
    uVar6 = (uVar6 >> 0xb ^ uVar6) * 0x41;
    uVar5 = (uint)(uVar6 >> 0x16) ^ (uint)uVar6;
  }
  aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(this_00->buckets).ptr;
  sVar4 = (this_00->buckets).size_;
  uVar8 = (int)sVar4 - 1U & uVar5;
  pHVar7 = (HashBucket *)0x0;
  do {
    pHVar10 = (HashBucket *)(aVar3.value + (ulong)uVar8 * 8);
    uVar1 = pHVar10->value;
    if (uVar1 == 1) {
      if (pHVar7 == (HashBucket *)0x0) {
        pHVar7 = pHVar10;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar7 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar10 = pHVar7;
        }
        *pHVar10 = (HashBucket)(((ulong)uVar5 | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
                 )0x0;
        goto LAB_003843cc;
      }
      if ((pHVar10->hash == uVar5) && (*(ulong *)(table.size_ + (ulong)(uVar1 - 2) * 0x10) == uVar2)
         ) {
        *this = (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
LAB_003843cc:
        MVar11.ptr.field_1.value = aVar3.value;
        MVar11.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar11.ptr;
      }
    }
    sVar9 = (ulong)uVar8 + 1;
    uVar8 = (uint)sVar9;
    if (sVar9 == sVar4) {
      uVar8 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }